

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::
~TreeEnsembleParameters_TreeNode_EvaluationInfo
          (TreeEnsembleParameters_TreeNode_EvaluationInfo *this)

{
  ~TreeEnsembleParameters_TreeNode_EvaluationInfo(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TreeEnsembleParameters_TreeNode_EvaluationInfo::~TreeEnsembleParameters_TreeNode_EvaluationInfo() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}